

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_ustar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  archive_string *as_00;
  dev_t dVar2;
  wchar_t local_44;
  wchar_t r;
  wchar_t err;
  archive_string *as;
  archive_entry_header_ustar *header;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_44 = L'\0';
  as_00 = &tar->entry_pathname;
  if (*(char *)((long)h + 0x159) == '\0') {
    (tar->entry_pathname).length = 0;
    archive_strncat(as_00,h,100);
  }
  else {
    (tar->entry_pathname).length = 0;
    archive_strncat(as_00,(void *)((long)h + 0x159),0x9b);
    if (as_00->s[(tar->entry_pathname).length - 1] != '/') {
      archive_strappend_char(as_00,'/');
    }
    archive_strncat(as_00,h,100);
  }
  wVar1 = _archive_entry_copy_pathname_l(entry,as_00->s,(tar->entry_pathname).length,tar->sconv);
  if (((wVar1 == L'\0') ||
      (local_44 = set_conversion_failed_error(a,tar->sconv,"Pathname"), a_local._4_4_ = local_44,
      local_44 != L'\xffffffe2')) &&
     (a_local._4_4_ = header_common(a,tar,entry,h), a_local._4_4_ != L'\xffffffe2')) {
    if (a_local._4_4_ < local_44) {
      local_44 = a_local._4_4_;
    }
    wVar1 = _archive_entry_copy_uname_l(entry,(char *)((long)h + 0x109),0x20,tar->sconv);
    if (((wVar1 == L'\0') ||
        (local_44 = set_conversion_failed_error(a,tar->sconv,"Uname"), a_local._4_4_ = local_44,
        local_44 != L'\xffffffe2')) &&
       ((wVar1 = _archive_entry_copy_gname_l(entry,(char *)((long)h + 0x129),0x20,tar->sconv),
        wVar1 == L'\0' ||
        (local_44 = set_conversion_failed_error(a,tar->sconv,"Gname"), a_local._4_4_ = local_44,
        local_44 != L'\xffffffe2')))) {
      if ((*(char *)((long)h + 0x9c) == '3') || (*(char *)((long)h + 0x9c) == '4')) {
        dVar2 = tar_atol((char *)((long)h + 0x149),8);
        archive_entry_set_rdevmajor(entry,dVar2);
        dVar2 = tar_atol((char *)((long)h + 0x151),8);
        archive_entry_set_rdevminor(entry,dVar2);
      }
      tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
      a_local._4_4_ = local_44;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
header_ustar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	struct archive_string *as;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;

	/* Copy name into an internal buffer to ensure null-termination. */
	as = &(tar->entry_pathname);
	if (header->prefix[0]) {
		archive_strncpy(as, header->prefix, sizeof(header->prefix));
		if (as->s[archive_strlen(as) - 1] != '/')
			archive_strappend_char(as, '/');
		archive_strncat(as, header->name, sizeof(header->name));
	} else {
		archive_strncpy(as, header->name, sizeof(header->name));
	}
	if (archive_entry_copy_pathname_l(entry, as->s, archive_strlen(as),
	    tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Handle rest of common fields. */
	r = header_common(a, tar, entry, h);
	if (r == ARCHIVE_FATAL)
		return (r);
	if (r < err)
		err = r;

	/* Handle POSIX ustar fields. */
	if (archive_entry_copy_uname_l(entry,
	    header->uname, sizeof(header->uname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Uname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	if (archive_entry_copy_gname_l(entry,
	    header->gname, sizeof(header->gname), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Gname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Parse out device numbers only for char and block specials. */
	if (header->typeflag[0] == '3' || header->typeflag[0] == '4') {
		archive_entry_set_rdevmajor(entry, (dev_t)
		    tar_atol(header->rdevmajor, sizeof(header->rdevmajor)));
		archive_entry_set_rdevminor(entry, (dev_t)
		    tar_atol(header->rdevminor, sizeof(header->rdevminor)));
	}

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);

	return (err);
}